

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppManager.cpp
# Opt level: O3

void __thiscall phpconvert::AppManager::run(AppManager *this,AppParams *params)

{
  bool bVar1;
  ZendParser *this_00;
  SystemException *this_01;
  
  bVar1 = AppParams::isValid(params);
  if (bVar1) {
    this_00 = (ZendParser *)operator_new(0x90);
    ZendParser::ZendParser(this_00);
    ParserManager::setWorker(this->parser,(BaseParser *)this_00);
    ParserManager::parse(this->parser,params);
    return;
  }
  this_01 = (SystemException *)__cxa_allocate_exception(0x10);
  SystemException::SystemException(this_01,INVALID_PARAMETERS);
  __cxa_throw(this_01,&SystemException::typeinfo,SystemException::~SystemException);
}

Assistant:

void AppManager::run(AppParams *params) {
        if (!params->isValid()) {
            throw SystemException(SystemException::INVALID_PARAMETERS);
        }
        ZendParser *worker = new ZendParser(); //@todo detect plugin
        BaseParser *w = worker;
        parser->setWorker(w);
        parser->parse(params);
    }